

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeSetEtaMaxEarlyStep(void *cvode_mem,realtype eta_max_es)

{
  long in_RDI;
  double in_XMM0_Qa;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetEtaMaxEarlyStep","cvode_mem = NULL illegal."
                  );
    local_4 = -0x15;
  }
  else {
    if (1.0 < in_XMM0_Qa) {
      *(double *)(in_RDI + 0x318) = in_XMM0_Qa;
    }
    else {
      *(undefined8 *)(in_RDI + 0x318) = 0x4024000000000000;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeSetEtaMaxEarlyStep(void* cvode_mem, realtype eta_max_es)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetEtaMaxEarlyStep",
                   MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  /* set allowed value or use default */
  if (eta_max_es <= ONE)
    cv_mem->cv_eta_max_es = ETA_MAX_ES_DEFAULT;
  else
    cv_mem->cv_eta_max_es = eta_max_es;

  return(CV_SUCCESS);
}